

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

bool parse_instruction(context *ctx,opcode *op)

{
  pointer pp_Var1;
  token_type tVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  _Head_base<0UL,_char_*,_false> _Var6;
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  token_type tVar11;
  ulong uVar12;
  token_predicate tVar13;
  char *pcVar14;
  long lVar15;
  token_type tVar16;
  context *pcVar17;
  char *pcVar18;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var19;
  uint uVar20;
  pointer pp_Var21;
  __buckets_ptr pp_Var22;
  bool bVar23;
  token token_1;
  error error_message;
  token token;
  opcode saved_op;
  context saved_context;
  undefined1 local_230 [24];
  undefined1 local_218 [32];
  int local_1f8;
  uint local_1e4;
  int local_1e0;
  uint local_1dc;
  undefined1 local_1d8 [24];
  char *pcStack_1c0;
  int local_1b8;
  _Head_base<0UL,_char_*,_false> local_1b0;
  uint local_1a4;
  uint local_1a0;
  token_type local_19c;
  undefined1 local_198 [32];
  _Storage<context::program_type,_true> local_178;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_168;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_148;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_140;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_138;
  undefined1 local_118 [24];
  __node_base_ptr p_Stack_100;
  _Storage<context::program_type,_true> local_f8;
  int iStack_f4;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  _Optional_payload_base<context::program_type> local_b8;
  bool local_b0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  int local_80;
  int iStack_7c;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_78;
  undefined8 local_50 [4];
  
  context::tokenize((token *)local_198,ctx);
  uVar7 = local_198._24_4_;
  if (local_198._24_4_ == none) {
LAB_0011eca7:
    return local_198._24_4_ != none;
  }
  if ((local_198._24_4_ == identifier) && (*(char *)local_198._16_8_ == '.')) {
    do {
      context::parse_option(ctx,(token *)local_198);
      if (local_198._24_4_ != identifier) break;
    } while (*(char *)local_198._16_8_ == '.');
  }
  if ((ctx->pc & 0x1fU) == 0) {
    ctx->pc = ctx->pc | 8;
  }
  if (local_198._24_4_ == at) {
    context::tokenize((token *)local_118,ctx);
    local_178 = local_f8;
    local_198._8_4_ = local_118._8_4_;
    local_198._12_4_ = local_118._12_4_;
    local_198._16_8_ = local_118._16_8_;
    local_198._24_8_ = p_Stack_100;
    local_198._0_8_ = local_118._0_8_;
    tVar16 = (token_type)local_198;
    confirm_type((token *)local_118,tVar16);
    if ((__uniq_ptr_impl<char,_std::default_delete<char[]>_>)local_118._0_8_ ==
        (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0) {
      local_118._0_8_ = (_Head_base<0UL,_char_*,_false>)0x0;
      uVar12 = ((ulong)(local_198._12_4_ != 0) << 3 | (long)(int)local_198._8_4_) << 0x10;
      if ((uVar12 & op->value) != 0) goto LAB_0011ece7;
      op->value = uVar12 | op->value;
      local_118._0_8_ = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)0x0;
    }
    if ((_Head_base<0UL,_char_*,_false>)local_118._0_8_ != (_Head_base<0UL,_char_*,_false>)0x0) {
      error::raise((error *)local_118,tVar16);
    }
    context::tokenize((token *)local_118,ctx);
    local_178 = local_f8;
    local_198._16_8_ = local_118._16_8_;
    local_198._24_8_ = p_Stack_100;
    local_198._0_8_ = local_118._0_8_;
    local_198._12_4_ = local_118._12_4_;
    local_198._8_4_ = local_118._8_4_;
  }
  else {
    if ((op->value & 0x70000) != 0) {
LAB_0011ece7:
      __assert_fail("(value & bits) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ReinUsesLisp[P]nxas/src/opcode.h"
                    ,0x31,"void opcode::add_bits(uint64_t)");
    }
    op->value = op->value | 0x70000;
  }
  local_19c = uVar7;
  if (local_198._24_4_ != identifier) {
    fatal_error((token *)local_198,"expected mnemonic");
  }
  context::context((context *)local_118,ctx);
  local_138._16_8_ = op->value;
  local_138._24_4_ = op->reuse;
  local_138._28_4_ = op->sched;
  local_1b0._M_head_impl = (char *)0x0;
  local_168._M_value._M_string_length = (size_type)&ctx->labels;
  local_138._M_value._M_string_length = (size_type)&ctx->type;
  local_138._M_value._M_dataplus._M_p = (_Alloc_hider)&ctx->entrypoint;
  local_148 = (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&ctx->second_entrypoint;
  local_140 = &_Stack_78;
  local_168._16_8_ = &ctx->second_num_gprs;
  local_168._24_8_ = local_50;
  local_1e0 = -1;
  lVar15 = 0;
LAB_0011e547:
  pcVar18 = table[lVar15].mnemonic;
  pcVar14 = pcVar18;
  iVar8 = equal((token *)local_198,pcVar18);
  tVar16 = (token_type)pcVar14;
  if (iVar8 == 0) {
    iVar8 = 6;
    goto LAB_0011ec42;
  }
  if ((op->value & table[lVar15].opcode) == 0) {
    op->value = op->value | table[lVar15].opcode;
    tVar13 = (token_predicate)context::tokenize((token *)local_218,ctx);
    if (((table[lVar15].flags & 1) == 0) ||
       (tVar13.index = ~(uint)op->value, tVar13.negated = 0, (tVar13.index & 0x70000) == 0)) {
      pp_Var1 = table[lVar15].operands.
                super__Vector_base<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      iVar8 = 0x3e9;
      for (pp_Var21 = table[lVar15].operands.
                      super__Vector_base<error_(*)(context_&,_token_&,_opcode_&),_std::allocator<error_(*)(context_&,_token_&,_opcode_&)>_>
                      ._M_impl.super__Vector_impl_data._M_start; pp_Var21 != pp_Var1;
          pp_Var21 = pp_Var21 + 1) {
        pcVar17 = ctx;
        tVar13 = (token_predicate)
                 (**pp_Var21)((context *)local_1d8,(token *)ctx,(opcode *)local_218);
        tVar16 = (token_type)pcVar17;
        if ((__buckets_ptr)local_1d8._0_8_ != (__buckets_ptr)0x0) {
          iVar8 = iVar8 + -1000;
          pp_Var22 = (__buckets_ptr)local_1d8._0_8_;
          goto LAB_0011eb2e;
        }
        iVar8 = iVar8 + 1;
      }
      tVar16 = 0x7e0;
      if (local_218._24_4_ == at) {
        local_230._12_4_ = 0;
        local_1e4 = 0;
        local_1dc = 0;
        local_230._16_4_ = 0;
        local_230._20_4_ = 0;
        local_168._M_value._M_dataplus._M_p = (_Alloc_hider)tVar13;
LAB_0011e647:
        context::tokenize((token *)local_1d8,ctx);
        local_1f8 = local_1b8;
        local_218._16_8_ = local_1d8._16_8_;
        local_218._24_8_ = pcStack_1c0;
        local_218._0_8_ = local_1d8._0_8_;
        local_218._8_8_ = local_1d8._8_8_;
        iVar9 = equal((token *)local_218,"WAIT");
        if (iVar9 == 0) {
          iVar9 = equal((token *)local_218,"WB");
          if ((iVar9 != 0) || (iVar9 = equal((token *)local_218,"RB"), iVar9 != 0)) {
            iVar9 = equal((token *)local_218,"WB");
            uVar10 = local_230._16_4_ & 0xff;
            if (iVar9 == 0) {
              uVar10 = local_230._20_4_ & 0xff;
            }
            if ((uVar10 & 1) == 0) {
              local_230._16_4_ = local_230._16_4_ & 0xff;
              local_230._20_4_ = local_230._20_4_ & 0xff;
              context::tokenize((token *)local_1d8,ctx);
              local_1f8 = local_1b8;
              local_218._16_8_ = local_1d8._16_8_;
              local_218._24_8_ = pcStack_1c0;
              local_218._0_8_ = local_1d8._0_8_;
              local_218._8_8_ = local_1d8._8_8_;
              tVar16 = (token_type)local_218;
              confirm_type((token *)local_230,tVar16);
              uVar3 = local_218._8_8_;
              if ((__buckets_ptr)local_230._0_8_ == (__buckets_ptr)0x0) {
                local_230._0_8_ = (__buckets_ptr)0x0;
                if ((ulong)local_218._8_8_ < 6) {
                  context::tokenize((token *)local_1d8,ctx);
                  if (iVar9 != 0) {
                    local_230._16_4_ = 1;
                  }
                  local_218._0_8_ = local_1d8._0_8_;
                  local_218._8_8_ = local_1d8._8_8_;
                  local_218._16_8_ = local_1d8._16_8_;
                  local_218._24_8_ = pcStack_1c0;
                  local_1f8 = local_1b8;
                  uVar10 = (uint)uVar3;
                  if (iVar9 == 0) {
                    local_230._20_4_ = 1;
                    uVar10 = local_1a4;
                    local_1a0 = (uint)uVar3;
                  }
                  goto LAB_0011e87f;
                }
                pcVar14 = "barrier index must be between 0 and 5 inclusively";
                goto LAB_0011eaf5;
              }
            }
            else {
              pcVar14 = "write";
              if (iVar9 == 0) {
                pcVar14 = "read";
              }
              pcVar18 = local_218;
              fail((token *)local_230,pcVar18,"%s barrier already specified",pcVar14);
              tVar16 = (token_type)pcVar18;
            }
            goto LAB_0011eb06;
          }
          iVar9 = equal((token *)local_218,"Y");
          if ((iVar9 != 0) || (iVar9 = equal((token *)local_218,"YIELD"), iVar9 != 0)) {
            if ((local_1e4 & 1) != 0) {
              pcVar14 = "yield already specified";
              goto LAB_0011eaf5;
            }
            context::tokenize((token *)local_1d8,ctx);
            local_1e4 = (uint)CONCAT71((uint7)(uint3)((uint)local_1b8 >> 8),1);
            local_218._0_8_ = local_1d8._0_8_;
            local_218._8_8_ = local_1d8._8_8_;
            local_218._16_8_ = local_1d8._16_8_;
            local_218._24_8_ = pcStack_1c0;
            local_1f8 = local_1b8;
            uVar10 = local_1a4;
LAB_0011e87f:
            local_1a4 = uVar10;
            if (local_218._24_4_ != at) goto LAB_0011ea2c;
            goto LAB_0011e647;
          }
          iVar9 = equal((token *)local_218,"DEP");
          if (iVar9 != 0) {
            context::tokenize((token *)local_1d8,ctx);
            local_1f8 = local_1b8;
            local_218._16_8_ = local_1d8._16_8_;
            local_218._24_8_ = pcStack_1c0;
            local_218._0_8_ = local_1d8._0_8_;
            local_218._8_8_ = local_1d8._8_8_;
            tVar16 = (token_type)local_218;
            confirm_type((token *)local_230,tVar16);
            uVar10 = local_230._12_4_;
            if ((__buckets_ptr)local_230._0_8_ == (__buckets_ptr)0x0) {
              local_230._0_8_ = (__buckets_ptr)0x0;
              if (5 < (ulong)local_218._8_8_) {
                pcVar14 = "dependency barrier index must be between 0 and 5 inclusively";
                goto LAB_0011eaf5;
              }
              uVar20 = 1 << ((byte)local_218._8_8_ & 0x1f);
              if (((uint)local_230._12_4_ >> ((uint)local_218._8_8_ & 0x1f) & 1) == 0) {
                pcVar17 = ctx;
                context::tokenize((token *)local_1d8,ctx);
                tVar16 = (token_type)pcVar17;
                uVar10 = uVar20 | local_230._12_4_;
                local_1f8 = local_1b8;
                local_218._16_8_ = local_1d8._16_8_;
                local_218._24_8_ = pcStack_1c0;
                local_218._0_8_ = local_1d8._0_8_;
                local_218._8_8_ = local_1d8._8_8_;
              }
              else {
                pcVar14 = local_218;
                fail((token *)local_230,pcVar14,"dependency barrier index %d already specified");
                tVar16 = (token_type)pcVar14;
              }
              uVar20 = local_230._12_4_ & uVar20;
              local_230._12_4_ = uVar10;
              uVar10 = local_1a4;
              if (uVar20 == 0) goto LAB_0011e87f;
            }
            goto LAB_0011eb06;
          }
          pcVar14 = "expected @WAIT, @WB, @RB, @DEP, or @YIELD/@Y";
        }
        else if ((local_1dc & 1) == 0) {
          context::tokenize((token *)local_1d8,ctx);
          local_1f8 = local_1b8;
          local_218._16_8_ = local_1d8._16_8_;
          local_218._24_8_ = pcStack_1c0;
          local_218._0_8_ = local_1d8._0_8_;
          local_218._8_8_ = local_1d8._8_8_;
          tVar16 = (token_type)local_218;
          confirm_type((token *)local_230,tVar16);
          if ((__buckets_ptr)local_230._0_8_ != (__buckets_ptr)0x0) goto LAB_0011eb06;
          local_230._0_8_ = (__buckets_ptr)0x0;
          local_168._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)local_218._8_8_;
          if ((ulong)local_218._8_8_ < 0x10) {
            context::tokenize((token *)local_1d8,ctx);
            local_1dc = (uint)CONCAT71((uint7)(uint3)((uint)local_1b8 >> 8),1);
            local_218._0_8_ = local_1d8._0_8_;
            local_218._8_8_ = local_1d8._8_8_;
            local_218._16_8_ = local_1d8._16_8_;
            local_218._24_8_ = pcStack_1c0;
            local_1f8 = local_1b8;
            uVar10 = local_1a4;
            goto LAB_0011e87f;
          }
          pcVar14 = "number of waited clocks must be between 0 and 15 inclusively";
        }
        else {
          pcVar14 = "clocks to stall are already specified";
        }
LAB_0011eaf5:
        pcVar18 = local_218;
        fail((token *)local_230,pcVar18,pcVar14);
        tVar16 = (token_type)pcVar18;
        goto LAB_0011eb06;
      }
      goto LAB_0011ea97;
    }
    pcVar14 = local_218;
    fail((token *)local_1d8,pcVar14,"%s does not support predicated execution",pcVar18);
    tVar16 = (token_type)pcVar14;
    iVar8 = 0;
    pp_Var22 = (__buckets_ptr)local_1d8._0_8_;
    goto LAB_0011eb2e;
  }
  goto LAB_0011ece7;
LAB_0011ea2c:
  tVar16 = local_168._0_4_ & (comma|identifier);
  if ((local_1dc & 1) == 0) {
    tVar16 = none;
  }
  tVar11 = (local_1a4 & 7) << 5;
  if ((local_230._16_4_ & 1) == 0) {
    tVar11 = 0xe0;
  }
  tVar2 = (local_1a0 & 7) << 8;
  if ((local_230._20_4_ & 1) == 0) {
    tVar2 = 0x700;
  }
  tVar16 = tVar2 | tVar11 | tVar16 | (uint)(byte)(((byte)local_1e4 & 1) << 4) |
           (local_230._12_4_ & 0x3f) << 0xb;
LAB_0011ea97:
  (op->sched).raw = tVar16;
  local_230._0_8_ = (__buckets_ptr)0x0;
LAB_0011eb06:
  pp_Var22 = (__buckets_ptr)local_230._0_8_;
  if ((__buckets_ptr)local_230._0_8_ == (__buckets_ptr)0x0) {
    tVar16 = (token_type)local_218;
    confirm_type((token *)local_1d8,tVar16);
    pp_Var22 = (__buckets_ptr)local_1d8._0_8_;
  }
LAB_0011eb2e:
  _Var6._M_head_impl = local_1b0._M_head_impl;
  if (pp_Var22 == (__buckets_ptr)0x0) {
    ctx->pc = ctx->pc + 8;
    iVar8 = 1;
  }
  else {
    if (local_1e0 < iVar8) {
      bVar23 = (__buckets_ptr)local_1b0._M_head_impl != (__buckets_ptr)0x0;
      local_1b0._M_head_impl = (char *)pp_Var22;
      if (bVar23) {
        operator_delete__(_Var6._M_head_impl);
      }
      pp_Var22 = (__buckets_ptr)0x0;
      local_1e0 = iVar8;
    }
    ctx->line = (int)local_f8;
    ctx->column = iStack_f4;
    ctx->text_begin = (char *)local_118._16_8_;
    ctx->text = (char *)p_Stack_100;
    ctx->pc = local_118._0_8_;
    ctx->filename = (char *)CONCAT44(local_118._12_4_,local_118._8_4_);
    if ((context *)local_118 != ctx) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,long>,std::allocator<std::pair<std::__cxx11::string_const,long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_168._M_value._M_string_length,&local_f0);
    }
    *(bool *)&((_Optional_payload_base<context::program_type> *)
              (local_138._M_value._M_string_length + 8))->_M_payload = local_b0;
    *(_Optional_payload_base<context::program_type> *)local_138._M_value._M_string_length = local_b8
    ;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_copy_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_138._M_value._M_dataplus._M_p,&local_a8);
    ctx->num_gprs = local_80;
    ctx->local_mem_size = iStack_7c;
    p_Var19 = local_140;
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_copy_assign(local_148,local_140);
    tVar16 = (token_type)p_Var19;
    uVar3 = *(undefined8 *)local_168._24_8_;
    uVar4 = *(undefined8 *)(local_168._24_8_ + 8);
    uVar5 = *(undefined8 *)(local_168._24_8_ + 0x14);
    *(undefined8 *)(local_168._16_8_ + 0xc) = *(undefined8 *)(local_168._24_8_ + 0xc);
    *(undefined8 *)(local_168._16_8_ + 0x14) = uVar5;
    *(undefined8 *)local_168._16_8_ = uVar3;
    *(undefined8 *)((array<unsigned_int,_3UL> *)(local_168._16_8_ + 8))->_M_elems = uVar4;
    op->value = local_138._16_8_;
    op->reuse = local_138._24_4_;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_138._28_4_;
    iVar8 = 0;
  }
  if (pp_Var22 != (__buckets_ptr)0x0) {
    operator_delete__(pp_Var22);
  }
LAB_0011ec42:
  if ((iVar8 != 6) && (iVar8 != 0)) {
    if ((__buckets_ptr)local_1b0._M_head_impl != (__buckets_ptr)0x0) {
      operator_delete__(local_1b0._M_head_impl);
    }
    context::~context((context *)local_118);
    local_198._24_4_ = local_19c;
    goto LAB_0011eca7;
  }
  lVar15 = lVar15 + 1;
  if (lVar15 == 0x109) {
    if ((__buckets_ptr)local_1b0._M_head_impl == (__buckets_ptr)0x0) {
      fatal_error((token *)local_198,"unknown mnemonic \x1b[1m%.*s\x1b[0m",local_198._8_8_,
                  local_198._16_8_);
    }
    error::raise((error *)&local_1b0,tVar16);
  }
  goto LAB_0011e547;
}

Assistant:

bool parse_instruction(context& ctx, opcode& op)
{
    token token = ctx.tokenize();
    if (token.type == token_type::none) {
        return false;
    }
    while (token.type == token_type::identifier && token.data.string[0] == '.') {
        ctx.parse_option(token);
    }
    if (ctx.pc % 0x20 == 0) {
        ctx.pc += 8;
    }
    if (token.type == token_type::at) {
        token = ctx.tokenize();
        if (error message = assemble_predicate(token, op, 16, 1); message) {
            message.raise();
        }
        token = ctx.tokenize();
    } else {
        // write always execute by default
        op.add_bits(7ULL << 16);
    }
    if (token.type != token_type::identifier) {
        fatal_error(token, "expected mnemonic");
    }
    const context saved_context = ctx;
    const opcode saved_op = op;
    error error_message;
    int error_score = -1;

    const size_t num_insns = sizeof(table) / sizeof(table[0]);
    for (size_t i = 0; i < num_insns; ++i) {
        const insn& insn = table[i];
        if (!equal(token, insn.mnemonic)) {
            continue;
        }
        auto [insn_error, score] = parse_insn(ctx, op, insn);
        if (!insn_error) {
            // successfully decoded instruction
            ctx.pc += 8;
            return true;
        }
        if (score > error_score) {
            error_message = std::move(insn_error);
            error_score = score;
        }
        // failure, restore context
        ctx = saved_context;
        op = saved_op;
    }
    if (error_message) {
        error_message.raise();
    } else {
        fatal_error(token, "unknown mnemonic \33[1m%.*s\33[0m", std::size(token.data.string),
                    std::data(token.data.string));
    }
}